

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QList<QString>_>_>::moveFromSpan
          (Span<QHashPrivate::Node<QString,_QList<QString>_>_> *this,
          Span<QHashPrivate::Node<QAbstractFileIconProvider::IconType,_QIcon>_> *fromSpan,
          size_t fromIndex,size_t to)

{
  undefined8 *puVar1;
  byte bVar2;
  long lVar3;
  Entry *pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Span<QHashPrivate::Node<QString,_QList<QString>_>_> SVar10;
  long lVar11;
  ulong uVar12;
  
  SVar10 = this[0x89];
  if (SVar10 == this[0x88]) {
    addStorage(this);
    SVar10 = this[0x89];
  }
  this[to] = SVar10;
  lVar3 = *(long *)(this + 0x80);
  lVar11 = (ulong)(byte)this[0x89] * 0x30;
  this[0x89] = *(Span<QHashPrivate::Node<QString,_QList<QString>_>_> *)(lVar3 + lVar11);
  bVar2 = fromSpan->offsets[fromIndex];
  uVar12 = (ulong)bVar2;
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar4 = fromSpan->entries;
  uVar5 = *(undefined8 *)pEVar4[uVar12 * 3].storage.data;
  uVar6 = *(undefined8 *)(pEVar4[uVar12 * 3].storage.data + 8);
  uVar7 = *(undefined8 *)pEVar4[uVar12 * 3 + 1].storage.data;
  uVar8 = *(undefined8 *)(pEVar4[uVar12 * 3 + 1].storage.data + 8);
  uVar9 = *(undefined8 *)(pEVar4[uVar12 * 3 + 2].storage.data + 8);
  puVar1 = (undefined8 *)(lVar3 + 0x20 + lVar11);
  *puVar1 = *(undefined8 *)pEVar4[uVar12 * 3 + 2].storage.data;
  puVar1[1] = uVar9;
  puVar1 = (undefined8 *)(lVar3 + 0x10 + lVar11);
  *puVar1 = uVar7;
  puVar1[1] = uVar8;
  *(undefined8 *)(lVar3 + lVar11) = uVar5;
  ((undefined8 *)(lVar3 + lVar11))[1] = uVar6;
  pEVar4[uVar12 * 3].storage.data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar2;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }